

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O1

void __thiscall ChaCha20::Crypt(ChaCha20 *this,Span<const_std::byte> input,Span<std::byte> output)

{
  long lVar1;
  uint i_1;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong uVar5;
  byte *pbVar6;
  long in_FS_OFFSET;
  Span<const_std::byte> in_bytes;
  Span<std::byte> output_00;
  Span<std::byte> out_bytes;
  
  pbVar6 = output.m_data;
  uVar3 = input.m_size;
  pbVar4 = input.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar3 != output.m_size) {
    __assert_fail("input.size() == output.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x131,"void ChaCha20::Crypt(Span<const std::byte>, Span<std::byte>)");
  }
  if (uVar3 != 0) {
    uVar5 = (ulong)this->m_bufleft;
    if (uVar5 != 0) {
      if (uVar3 <= uVar5) {
        uVar5 = uVar3;
      }
      uVar2 = 0;
      do {
        pbVar6[uVar2] =
             (this->m_buffer)._M_elems[((int)uVar2 - this->m_bufleft) + 0x40] ^ pbVar4[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
      this->m_bufleft = this->m_bufleft - (int)uVar5;
      pbVar6 = pbVar6 + uVar5;
      pbVar4 = pbVar4 + uVar5;
      uVar3 = uVar3 - uVar5;
    }
    if (0x3f < uVar3) {
      uVar5 = uVar3 & 0xffffffffffffffc0;
      in_bytes.m_size = uVar5;
      in_bytes.m_data = pbVar4;
      out_bytes.m_size = uVar5;
      out_bytes.m_data = pbVar6;
      ChaCha20Aligned::Crypt(&this->m_aligned,in_bytes,out_bytes);
      pbVar6 = pbVar6 + uVar5;
      pbVar4 = pbVar4 + uVar5;
      uVar3 = (ulong)((uint)uVar3 & 0x3f);
    }
    if (uVar3 != 0) {
      output_00.m_size = 0x40;
      output_00.m_data = (this->m_buffer)._M_elems;
      ChaCha20Aligned::Keystream(&this->m_aligned,output_00);
      uVar5 = 0;
      do {
        pbVar6[uVar5] = (this->m_buffer)._M_elems[uVar5] ^ pbVar4[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
      this->m_bufleft = 0x40 - (int)uVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChaCha20::Crypt(Span<const std::byte> input, Span<std::byte> output) noexcept
{
    assert(input.size() == output.size());

    if (!input.size()) return;
    if (m_bufleft) {
        unsigned reuse = std::min<size_t>(m_bufleft, input.size());
        for (unsigned i = 0; i < reuse; i++) {
            output[i] = input[i] ^ m_buffer[m_aligned.BLOCKLEN - m_bufleft + i];
        }
        m_bufleft -= reuse;
        output = output.subspan(reuse);
        input = input.subspan(reuse);
    }
    if (input.size() >= m_aligned.BLOCKLEN) {
        size_t blocks = input.size() / m_aligned.BLOCKLEN;
        m_aligned.Crypt(input.first(blocks * m_aligned.BLOCKLEN), output.first(blocks * m_aligned.BLOCKLEN));
        output = output.subspan(blocks * m_aligned.BLOCKLEN);
        input = input.subspan(blocks * m_aligned.BLOCKLEN);
    }
    if (!input.empty()) {
        m_aligned.Keystream(m_buffer);
        for (unsigned i = 0; i < input.size(); i++) {
            output[i] = input[i] ^ m_buffer[i];
        }
        m_bufleft = m_aligned.BLOCKLEN - input.size();
    }
}